

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Parser
cm_expat_XML_ParserCreate_MM
          (XML_Char *encodingName,XML_Memory_Handling_Suite *memsuite,XML_Char *nameSep)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *parser;
  code *pcVar3;
  undefined8 uVar4;
  XML_Char *pXVar5;
  ENCODING *pEVar6;
  XML_Memory_Handling_Suite *ms;
  
  if (memsuite == (XML_Memory_Handling_Suite *)0x0) {
    parser = (undefined8 *)malloc(0x498);
    parser[3] = malloc;
    parser[4] = realloc;
    pcVar3 = free;
  }
  else {
    parser = (undefined8 *)(*memsuite->malloc_fcn)(0x498);
    parser[3] = memsuite->malloc_fcn;
    parser[4] = memsuite->realloc_fcn;
    pcVar3 = memsuite->free_fcn;
  }
  parser[5] = pcVar3;
  pXVar5 = (XML_Char *)0x0;
  if (parser != (undefined8 *)0x0) {
    parser[0x41] = prologInitProcessor;
    cm_expat_XmlPrologStateInit((PROLOG_STATE *)(parser + 0x3e));
    *parser = 0;
    parser[1] = 0;
    parser[0xd] = 0;
    parser[0xe] = 0;
    parser[0xf] = 0;
    parser[0x10] = 0;
    parser[0x11] = 0;
    parser[0x12] = 0;
    parser[0x13] = 0;
    parser[0x14] = 0;
    parser[0x15] = 0;
    parser[0x16] = 0;
    parser[0x17] = 0;
    parser[0x18] = 0;
    parser[0x19] = 0;
    parser[0x1a] = 0;
    parser[0x1b] = 0;
    parser[0x1c] = 0;
    parser[0x1d] = parser;
    parser[2] = 0;
    parser[0x81] = 0;
    parser[0x82] = 0;
    *(undefined4 *)(parser + 0x42) = 0;
    parser[6] = 0;
    parser[7] = 0;
    parser[8] = 0;
    parser[9] = 0;
    parser[10] = 0;
    parser[0x1e] = 0;
    parser[0x1f] = 0;
    parser[0x20] = 0;
    parser[0x21] = 0;
    parser[0x22] = 0;
    parser[0x45] = 0;
    parser[0x46] = 0;
    parser[0x43] = 0;
    parser[0x44] = 0;
    *(undefined8 *)((long)parser + 0x23c) = 0;
    *(undefined8 *)((long)parser + 0x244) = 0;
    *(undefined8 *)((long)parser + 0x24c) = 0;
    *(undefined8 *)((long)parser + 0x254) = 0;
    *(undefined8 *)((long)parser + 0x25c) = 0;
    *(undefined8 *)((long)parser + 0x264) = 0;
    *(undefined8 *)((long)parser + 0x26c) = 0;
    *(undefined8 *)((long)parser + 0x274) = 0;
    parser[0x4f] = 0;
    parser[0x50] = 0;
    parser[0x7a] = 0;
    parser[0x7b] = 0;
    parser[0x7c] = 0;
    parser[0x7d] = 0;
    *(undefined4 *)(parser + 0x7e) = 0x10;
    puVar1 = parser + 3;
    uVar4 = (*(code *)parser[3])(0x200);
    parser[0x80] = uVar4;
    *(undefined4 *)((long)parser + 0x3f4) = 0;
    uVar4 = (*(code *)parser[3])(0x400);
    parser[0xb] = uVar4;
    parser[0x3a] = 0;
    parser[0x3b] = 0;
    parser[0x3c] = 0;
    parser[0x3d] = 0;
    parser[0x8f] = 0;
    parser[0x90] = 0;
    *(undefined1 *)(parser + 0x91) = 0x21;
    parser[0x92] = 0;
    *(undefined4 *)((long)parser + 0x48c) = 0;
    parser[0x39] = 0;
    parser[0x83] = 0;
    parser[0x84] = 0;
    parser[0x85] = 0;
    parser[0x86] = 0;
    parser[0x87] = 0;
    parser[0x88] = puVar1;
    parser[0x89] = 0;
    parser[0x8a] = 0;
    parser[0x8b] = 0;
    parser[0x8c] = 0;
    parser[0x8d] = 0;
    parser[0x8e] = puVar1;
    if (encodingName != (XML_Char *)0x0) {
      pXVar5 = poolCopyString((STRING_POOL *)(parser + 0x83),encodingName);
    }
    parser[0x38] = pXVar5;
    parser[0x79] = 0;
    parser[0x66] = 0;
    parser[0x67] = 0;
    parser[0x68] = 0;
    parser[0x69] = 0;
    parser[0x6a] = 0;
    parser[0x6b] = puVar1;
    parser[0x52] = 0;
    parser[0x53] = 0;
    parser[0x54] = 0;
    parser[0x55] = 0;
    parser[0x56] = puVar1;
    parser[0x57] = 0;
    parser[0x58] = 0;
    parser[0x59] = 0;
    parser[0x5a] = 0;
    parser[0x5b] = puVar1;
    parser[0x5c] = 0;
    parser[0x5d] = 0;
    parser[0x5e] = 0;
    parser[0x5f] = 0;
    parser[0x60] = puVar1;
    parser[99] = 0;
    parser[100] = 0;
    parser[0x61] = 0;
    parser[0x62] = 0;
    parser[0x65] = puVar1;
    *(undefined4 *)(parser + 0x6c) = 1;
    *(undefined4 *)((long)parser + 900) = 0;
    *(undefined8 *)((long)parser + 0x374) = 0;
    *(undefined8 *)((long)parser + 0x37c) = 0;
    *(undefined8 *)((long)parser + 0x364) = 0;
    *(undefined8 *)((long)parser + 0x36c) = 0;
    parser[0x71] = puVar1;
    parser[0x72] = 0;
    parser[0x73] = 0;
    *(undefined4 *)(parser + 0x74) = 0;
    parser[0x75] = 0;
    parser[0x76] = 0;
    parser[0x77] = 0;
    parser[0x78] = 0;
    if (parser[0x80] != 0) {
      if ((parser[0xb] != 0) && (encodingName == (XML_Char *)0x0 || pXVar5 != (XML_Char *)0x0)) {
        parser[0xc] = parser[0xb] + 0x400;
        if (nameSep == (XML_Char *)0x0) {
          cm_expat_XmlInitEncoding
                    ((INIT_ENCODING *)(parser + 0x24),(ENCODING **)(parser + 0x23),(char *)0x0);
          pEVar6 = cm_expat_XmlGetUtf8InternalEncoding();
          parser[0x37] = pEVar6;
          return parser;
        }
        cm_expat_XmlInitEncodingNS
                  ((INIT_ENCODING *)(parser + 0x24),(ENCODING **)(parser + 0x23),(char *)0x0);
        *(undefined4 *)(parser + 0x39) = 1;
        pEVar6 = cm_expat_XmlGetUtf8InternalEncodingNS();
        parser[0x37] = pEVar6;
        *(XML_Char *)(parser + 0x91) = *nameSep;
        iVar2 = setContext(parser,"xml=http://www.w3.org/XML/1998/namespace");
        if (iVar2 != 0) {
          return parser;
        }
      }
    }
    cm_expat_XML_ParserFree(parser);
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser
XML_ParserCreate_MM(const XML_Char *encodingName,
                    const XML_Memory_Handling_Suite *memsuite,
                    const XML_Char *nameSep) {
  
  XML_Parser parser;
  static
  const XML_Char implicitContext[] = {
    XML_T('x'), XML_T('m'), XML_T('l'), XML_T('='),
    XML_T('h'), XML_T('t'), XML_T('t'), XML_T('p'), XML_T(':'),
    XML_T('/'), XML_T('/'), XML_T('w'), XML_T('w'), XML_T('w'),
    XML_T('.'), XML_T('w'), XML_T('3'),
    XML_T('.'), XML_T('o'), XML_T('r'), XML_T('g'),
    XML_T('/'), XML_T('X'), XML_T('M'), XML_T('L'),
    XML_T('/'), XML_T('1'), XML_T('9'), XML_T('9'), XML_T('8'),
    XML_T('/'), XML_T('n'), XML_T('a'), XML_T('m'), XML_T('e'),
    XML_T('s'), XML_T('p'), XML_T('a'), XML_T('c'), XML_T('e'),
    XML_T('\0')
  };


  if (memsuite) {
    XML_Memory_Handling_Suite *mtemp;
    parser = memsuite->malloc_fcn(sizeof(Parser));
    mtemp = &(((Parser *) parser)->m_mem);
    mtemp->malloc_fcn = memsuite->malloc_fcn;
    mtemp->realloc_fcn = memsuite->realloc_fcn;
    mtemp->free_fcn = memsuite->free_fcn;
  }
  else {
    XML_Memory_Handling_Suite *mtemp;
    parser = malloc(sizeof(Parser));
    mtemp = &(((Parser *) parser)->m_mem);
    mtemp->malloc_fcn = malloc;
    mtemp->realloc_fcn = realloc;
    mtemp->free_fcn = free;
  }

  if (!parser)
    return parser;
  processor = prologInitProcessor;
  XmlPrologStateInit(&prologState);
  userData = 0;
  handlerArg = 0;
  startElementHandler = 0;
  endElementHandler = 0;
  characterDataHandler = 0;
  processingInstructionHandler = 0;
  commentHandler = 0;
  startCdataSectionHandler = 0;
  endCdataSectionHandler = 0;
  defaultHandler = 0;
  startDoctypeDeclHandler = 0;
  endDoctypeDeclHandler = 0;
  unparsedEntityDeclHandler = 0;
  notationDeclHandler = 0;
  startNamespaceDeclHandler = 0;
  endNamespaceDeclHandler = 0;
  notStandaloneHandler = 0;
  externalEntityRefHandler = 0;
  externalEntityRefHandlerArg = parser;
  unknownEncodingHandler = 0;
  elementDeclHandler = 0;
  attlistDeclHandler = 0;
  entityDeclHandler = 0;
  xmlDeclHandler = 0;
  buffer = 0;
  bufferPtr = 0;
  bufferEnd = 0;
  parseEndByteIndex = 0;
  parseEndPtr = 0;
  bufferLim = 0;
  declElementType = 0;
  declAttributeId = 0;
  declEntity = 0;
  doctypeName = 0;
  doctypeSysid = 0;
  doctypePubid = 0;
  declAttributeType = 0;
  declNotationName = 0;
  declNotationPublicId = 0;
  memset(&position, 0, sizeof(POSITION));
  errorCode = XML_ERROR_NONE;
  eventPtr = 0;
  eventEndPtr = 0;
  positionPtr = 0;
  openInternalEntities = 0;
  tagLevel = 0;
  tagStack = 0;
  freeTagList = 0;
  freeBindingList = 0;
  inheritedBindings = 0;
  attsSize = INIT_ATTS_SIZE;
  atts = MALLOC(attsSize * sizeof(ATTRIBUTE));
  nSpecifiedAtts = 0;
  dataBuf = MALLOC(INIT_DATA_BUF_SIZE * sizeof(XML_Char));
  groupSize = 0;
  groupConnector = 0;
  hadExternalDoctype = 0;
  unknownEncodingMem = 0;
  unknownEncodingRelease = 0;
  unknownEncodingData = 0;
  unknownEncodingHandlerData = 0;
  namespaceSeparator = '!';
#ifdef XML_DTD
  parentParser = 0;
  paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif
  ns = 0;
  ns_triplets = 0;
  poolInit(&tempPool, &(((Parser *) parser)->m_mem));
  poolInit(&temp2Pool, &(((Parser *) parser)->m_mem));
  protocolEncodingName = encodingName ? poolCopyString(&tempPool, encodingName) : 0;
  curBase = 0;
  if (!dtdInit(&dtd, parser) || !atts || !dataBuf
      || (encodingName && !protocolEncodingName)) {
    XML_ParserFree(parser);
    return 0;
  }
  dataBufEnd = dataBuf + INIT_DATA_BUF_SIZE;

  if (nameSep) {
    XmlInitEncodingNS(&initEncoding, &encoding, 0);
    ns = 1;
    internalEncoding = XmlGetInternalEncodingNS();
    namespaceSeparator = *nameSep;

    if (! setContext(parser, implicitContext)) {
      XML_ParserFree(parser);
      return 0;
    }
  }
  else {
    XmlInitEncoding(&initEncoding, &encoding, 0);
    internalEncoding = XmlGetInternalEncoding();
  }

  return parser;
}